

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::ExtensionSet::UnsafeShallowSwapExtension
          (ExtensionSet *this,ExtensionSet *other,int number)

{
  char cVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  bool bVar8;
  undefined1 uVar9;
  bool bVar10;
  TrivialAtomicInt TVar11;
  Nullable<const_char_*> pcVar12;
  Arena **v1;
  Arena **v2;
  char *failure_msg;
  LogMessage *pLVar13;
  Extension *pEVar14;
  Extension *pEVar15;
  pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool> pVar16;
  LogMessage local_50;
  Voidify local_39;
  Nullable<const_char_*> local_38;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  Extension *other_ext;
  Extension *this_ext;
  ExtensionSet *pEStack_18;
  int number_local;
  ExtensionSet *other_local;
  ExtensionSet *this_local;
  
  if (this != other) {
    this_ext._4_4_ = number;
    pEStack_18 = other;
    other_local = this;
    other_ext = FindOrNull(this,number);
    absl_log_internal_check_op_result =
         (Nullable<const_char_*>)FindOrNull(pEStack_18,this_ext._4_4_);
    if (other_ext != (Extension *)absl_log_internal_check_op_result) {
      v1 = absl::lts_20250127::log_internal::GetReferenceableValue<google::protobuf::Arena*>
                     (&this->arena_);
      v2 = absl::lts_20250127::log_internal::GetReferenceableValue<google::protobuf::Arena*>
                     (&pEStack_18->arena_);
      local_38 = absl::lts_20250127::log_internal::
                 Check_EQImpl<google::protobuf::Arena*,google::protobuf::Arena*>
                           (v1,v2,"arena_ == other->arena_");
      pEVar14 = other_ext;
      pcVar12 = absl_log_internal_check_op_result;
      if (local_38 != (Nullable<const_char_*>)0x0) {
        failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_38);
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_50,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set.cc"
                   ,0x4fb,failure_msg);
        pLVar13 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_50);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_39,pLVar13);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_50);
      }
      if ((other_ext == (Extension *)0x0) ||
         (absl_log_internal_check_op_result == (Nullable<const_char_*>)0x0)) {
        if (other_ext == (Extension *)0x0) {
          pVar16 = Insert(this,this_ext._4_4_);
          pEVar14 = pVar16.first;
          (pEVar14->field_0).int64_t_value = *(int64_t *)pcVar12;
          cVar1 = pcVar12[9];
          cVar2 = pcVar12[10];
          cVar3 = pcVar12[0xb];
          cVar4 = pcVar12[0xc];
          cVar5 = pcVar12[0xd];
          cVar6 = pcVar12[0xe];
          cVar7 = pcVar12[0xf];
          pEVar14->type = pcVar12[8];
          pEVar14->is_repeated = (bool)cVar1;
          pEVar14->field_0xa = cVar2;
          pEVar14->is_packed = (bool)cVar3;
          (pEVar14->cached_size).int_[0] = cVar4;
          (pEVar14->cached_size).int_[1] = cVar5;
          (pEVar14->cached_size).int_[2] = cVar6;
          (pEVar14->cached_size).int_[3] = cVar7;
          pEVar14->descriptor = *(FieldDescriptor **)(pcVar12 + 0x10);
          Erase(pEStack_18,this_ext._4_4_);
        }
        else {
          pVar16 = Insert(pEStack_18,this_ext._4_4_);
          pEVar15 = pVar16.first;
          pEVar15->field_0 = pEVar14->field_0;
          bVar8 = pEVar14->is_repeated;
          uVar9 = pEVar14->field_0xa;
          bVar10 = pEVar14->is_packed;
          TVar11.int_ = (pEVar14->cached_size).int_[0];
          pEVar15->type = pEVar14->type;
          pEVar15->is_repeated = bVar8;
          pEVar15->field_0xa = uVar9;
          pEVar15->is_packed = bVar10;
          pEVar15->cached_size = (TrivialAtomicInt)TVar11.int_;
          pEVar15->descriptor = pEVar14->descriptor;
          Erase(this,this_ext._4_4_);
        }
      }
      else {
        std::swap<google::protobuf::internal::ExtensionSet::Extension>
                  (other_ext,(Extension *)absl_log_internal_check_op_result);
      }
    }
  }
  return;
}

Assistant:

void ExtensionSet::UnsafeShallowSwapExtension(ExtensionSet* other, int number) {
  if (this == other) return;

  Extension* this_ext = FindOrNull(number);
  Extension* other_ext = other->FindOrNull(number);

  if (this_ext == other_ext) return;

  ABSL_DCHECK_EQ(arena_, other->arena_);

  if (this_ext != nullptr && other_ext != nullptr) {
    std::swap(*this_ext, *other_ext);
  } else if (this_ext == nullptr) {
    *Insert(number).first = *other_ext;
    other->Erase(number);
  } else {
    *other->Insert(number).first = *this_ext;
    Erase(number);
  }
}